

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeCreator.cpp
# Opt level: O3

Molecule * __thiscall
OpenMD::MoleculeCreator::createMolecule
          (MoleculeCreator *this,ForceField *ff,MoleculeStamp *molStamp,int globalIndex,
          LocalIndexManager *localIndexMan)

{
  Atom *sd;
  Atom *sd_00;
  LocalIndexManager *pLVar1;
  MoleculeStamp *pMVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  _Var4;
  pointer ppCVar5;
  undefined4 extraout_var_06;
  pointer ppCVar6;
  ConstraintElem *this_00;
  ConstraintElem *this_01;
  ConstraintPair *cp;
  long lVar7;
  pointer ppAVar8;
  pointer ppCVar9;
  ulong uVar10;
  Molecule *pMVar11;
  long lVar12;
  CutoffGroup *pCVar13;
  undefined1 uVar14;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> freeAtoms;
  Atom *local_68;
  Molecule *local_60;
  LocalIndexManager *local_58;
  MoleculeStamp *local_50;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_48;
  iterator iStack_40;
  Atom **local_38;
  
  local_58 = localIndexMan;
  local_60 = (Molecule *)operator_new(400);
  Molecule::Molecule(local_60,globalIndex,molStamp);
  pLVar1 = local_58;
  lVar7 = (long)(molStamp->atomStamps_).
                super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(molStamp->atomStamps_).
                super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (lVar7 != 0) {
    lVar7 = lVar7 >> 3;
    lVar7 = lVar7 + (ulong)(lVar7 == 0);
    lVar12 = 0;
    do {
      iVar3 = (*this->_vptr_MoleculeCreator[2])
                        (this,ff,*(undefined8 *)
                                  ((long)(molStamp->atomStamps_).
                                         super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start +
                                  (lVar12 >> 0x1d)),pLVar1);
      local_68 = (Atom *)CONCAT44(extraout_var,iVar3);
      Molecule::addAtom(local_60,local_68);
      lVar12 = lVar12 + 0x100000000;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  pMVar11 = local_60;
  lVar7 = (long)(molStamp->rigidBodyStamps_).
                super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(molStamp->rigidBodyStamps_).
                super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar7 != 0) {
    lVar7 = lVar7 >> 3;
    lVar7 = lVar7 + (ulong)(lVar7 == 0);
    lVar12 = 0;
    do {
      iVar3 = (*this->_vptr_MoleculeCreator[3])
                        (this,molStamp,pMVar11,
                         *(undefined8 *)
                          ((long)(molStamp->rigidBodyStamps_).
                                 super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start + (lVar12 >> 0x1d)),
                         pLVar1);
      Molecule::addRigidBody(pMVar11,(RigidBody *)CONCAT44(extraout_var_00,iVar3));
      lVar12 = lVar12 + 0x100000000;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  lVar7 = (long)(molStamp->bondStamps_).
                super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(molStamp->bondStamps_).
                super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (lVar7 != 0) {
    lVar7 = lVar7 >> 3;
    lVar7 = lVar7 + (ulong)(lVar7 == 0);
    lVar12 = 0;
    do {
      iVar3 = (*this->_vptr_MoleculeCreator[4])
                        (this,ff,pMVar11,
                         *(undefined8 *)
                          ((long)(molStamp->bondStamps_).
                                 super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start + (lVar12 >> 0x1d)),
                         pLVar1);
      Molecule::addBond(pMVar11,(Bond *)CONCAT44(extraout_var_01,iVar3));
      lVar12 = lVar12 + 0x100000000;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  lVar7 = (long)(molStamp->bendStamps_).
                super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(molStamp->bendStamps_).
                super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (lVar7 != 0) {
    lVar7 = lVar7 >> 3;
    lVar7 = lVar7 + (ulong)(lVar7 == 0);
    lVar12 = 0;
    do {
      iVar3 = (*this->_vptr_MoleculeCreator[5])
                        (this,ff,pMVar11,
                         *(undefined8 *)
                          ((long)(molStamp->bendStamps_).
                                 super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start + (lVar12 >> 0x1d)),
                         pLVar1);
      Molecule::addBend(pMVar11,(Bend *)CONCAT44(extraout_var_02,iVar3));
      lVar12 = lVar12 + 0x100000000;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  lVar7 = (long)(molStamp->torsionStamps_).
                super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(molStamp->torsionStamps_).
                super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (lVar7 != 0) {
    lVar7 = lVar7 >> 3;
    lVar7 = lVar7 + (ulong)(lVar7 == 0);
    lVar12 = 0;
    do {
      iVar3 = (*this->_vptr_MoleculeCreator[6])
                        (this,ff,pMVar11,
                         *(undefined8 *)
                          ((long)(molStamp->torsionStamps_).
                                 super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start + (lVar12 >> 0x1d)),
                         pLVar1);
      Molecule::addTorsion(pMVar11,(Torsion *)CONCAT44(extraout_var_03,iVar3));
      lVar12 = lVar12 + 0x100000000;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  lVar7 = (long)(molStamp->inversionStamps_).
                super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(molStamp->inversionStamps_).
                super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_50 = molStamp;
  if (lVar7 != 0) {
    lVar7 = lVar7 >> 3;
    lVar7 = lVar7 + (ulong)(lVar7 == 0);
    lVar12 = 0;
    do {
      iVar3 = (*this->_vptr_MoleculeCreator[7])
                        (this,ff,pMVar11,
                         *(undefined8 *)
                          ((long)(local_50->inversionStamps_).
                                 super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start + (lVar12 >> 0x1d)),
                         pLVar1);
      if ((Inversion *)CONCAT44(extraout_var_04,iVar3) != (Inversion *)0x0) {
        Molecule::addInversion(pMVar11,(Inversion *)CONCAT44(extraout_var_04,iVar3));
      }
      lVar12 = lVar12 + 0x100000000;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  pMVar2 = local_50;
  lVar7 = (long)(local_50->cutoffGroupStamps_).
                super__Vector_base<OpenMD::CutoffGroupStamp_*,_std::allocator<OpenMD::CutoffGroupStamp_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(local_50->cutoffGroupStamps_).
                super__Vector_base<OpenMD::CutoffGroupStamp_*,_std::allocator<OpenMD::CutoffGroupStamp_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar7 != 0) {
    lVar7 = lVar7 >> 3;
    lVar7 = lVar7 + (ulong)(lVar7 == 0);
    lVar12 = 0;
    do {
      iVar3 = (*this->_vptr_MoleculeCreator[8])
                        (this,pMVar11,
                         *(undefined8 *)
                          ((long)(pMVar2->cutoffGroupStamps_).
                                 super__Vector_base<OpenMD::CutoffGroupStamp_*,_std::allocator<OpenMD::CutoffGroupStamp_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start + (lVar12 >> 0x1d)),
                         pLVar1);
      Molecule::addCutoffGroup(pMVar11,(CutoffGroup *)CONCAT44(extraout_var_05,iVar3));
      lVar12 = lVar12 + 0x100000000;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  pLVar1 = local_58;
  local_48._M_current = (Atom **)0x0;
  iStack_40._M_current = (Atom **)0x0;
  local_38 = (Atom **)0x0;
  ppAVar8 = (pMVar11->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppAVar8 ==
      (pMVar11->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_68 = (Atom *)0x0;
  }
  else {
    local_68 = *ppAVar8;
    if (local_68 != (Atom *)0x0) {
      do {
        ppAVar8 = ppAVar8 + 1;
        if (iStack_40._M_current == local_38) {
          std::vector<OpenMD::Atom*,std::allocator<OpenMD::Atom*>>::
          _M_realloc_insert<OpenMD::Atom*const&>
                    ((vector<OpenMD::Atom*,std::allocator<OpenMD::Atom*>> *)&local_48,iStack_40,
                     &local_68);
        }
        else {
          *iStack_40._M_current = local_68;
          iStack_40._M_current = iStack_40._M_current + 1;
        }
        if (ppAVar8 ==
            (local_60->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          local_68 = (Atom *)0x0;
          goto LAB_00208844;
        }
        local_68 = *ppAVar8;
      } while (local_68 != (Atom *)0x0);
      local_68 = (Atom *)0x0;
    }
  }
LAB_00208844:
  ppCVar9 = (local_60->cutoffGroups_).
            super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppCVar5 = (local_60->cutoffGroups_).
            super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if ((ppCVar9 != ppCVar5) && (pCVar13 = *ppCVar9, pCVar13 != (CutoffGroup *)0x0)) {
    do {
      ppAVar8 = (pCVar13->cutoffAtomList).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (ppAVar8 ==
          (pCVar13->cutoffAtomList).
          super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_68 = (Atom *)0x0;
      }
      else {
        local_68 = *ppAVar8;
        if (local_68 != (Atom *)0x0) {
          do {
            ppAVar8 = ppAVar8 + 1;
            _Var4 = std::
                    __remove_if<__gnu_cxx::__normal_iterator<OpenMD::Atom**,std::vector<OpenMD::Atom*,std::allocator<OpenMD::Atom*>>>,__gnu_cxx::__ops::_Iter_equals_val<OpenMD::Atom*const>>
                              (local_48,iStack_40._M_current,&local_68);
            if (_Var4._M_current != iStack_40._M_current) {
              iStack_40._M_current = _Var4._M_current;
            }
          } while ((ppAVar8 !=
                    (pCVar13->cutoffAtomList).
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_finish) &&
                  (local_68 = *ppAVar8, local_68 != (Atom *)0x0));
          local_68 = (Atom *)0x0;
          ppCVar5 = (local_60->cutoffGroups_).
                    super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
      ppCVar9 = ppCVar9 + 1;
    } while ((ppCVar9 != ppCVar5) && (pCVar13 = *ppCVar9, pCVar13 != (CutoffGroup *)0x0));
  }
  pMVar2 = local_50;
  pMVar11 = local_60;
  _Var4._M_current = local_48._M_current;
  if (local_48._M_current != iStack_40._M_current) {
    do {
      iVar3 = (*this->_vptr_MoleculeCreator[9])(this,pMVar11,*_Var4._M_current,pLVar1);
      Molecule::addCutoffGroup(pMVar11,(CutoffGroup *)CONCAT44(extraout_var_06,iVar3));
      _Var4._M_current = _Var4._M_current + 1;
    } while (_Var4._M_current != iStack_40._M_current);
  }
  (*this->_vptr_MoleculeCreator[10])(this,pMVar11);
  ppCVar6 = (pMVar2->constraintStamps_).
            super__Vector_base<OpenMD::ConstraintStamp_*,_std::allocator<OpenMD::ConstraintStamp_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((pMVar2->constraintStamps_).
      super__Vector_base<OpenMD::ConstraintStamp_*,_std::allocator<OpenMD::ConstraintStamp_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppCVar6) {
    lVar7 = 0;
    uVar10 = 0;
    do {
      lVar12 = *(long *)((long)ppCVar6 + (lVar7 >> 0x1d));
      if (*(char *)(lVar12 + 0xca) == '\0') {
        uVar14 = *(undefined1 *)(lVar12 + 0xcb);
      }
      else {
        uVar14 = false;
      }
      if (*(char *)(lVar12 + 0x92) == '\x01') {
        memcpy(&painCave,
               "Constraint Error: A non-bond constraint was specified\n\twithout providing a value for the constrainedDistance.\n"
               ,0x6f);
        painCave.isFatal = 1;
        simError();
      }
      else {
        ppAVar8 = (pMVar11->atoms_).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        sd = ppAVar8[*(uint *)(lVar12 + 0xd0)];
        sd_00 = ppAVar8[*(uint *)(lVar12 + 0xd4)];
        local_58 = *(LocalIndexManager **)(lVar12 + 0x98);
        this_00 = (ConstraintElem *)operator_new(0x28);
        ConstraintElem::ConstraintElem(this_00,&sd->super_StuntDouble);
        this_01 = (ConstraintElem *)operator_new(0x28);
        ConstraintElem::ConstraintElem(this_01,&sd_00->super_StuntDouble);
        cp = (ConstraintPair *)operator_new(0x28);
        cp->consElem1_ = this_00;
        cp->consElem2_ = this_01;
        cp->dist2 = (double)local_58 * (double)local_58;
        cp->force_ = 0.0;
        cp->printForce_ = (bool)uVar14;
        Molecule::addConstraintPair(local_60,cp);
      }
      uVar10 = uVar10 + 1;
      ppCVar6 = (local_50->constraintStamps_).
                super__Vector_base<OpenMD::ConstraintStamp_*,_std::allocator<OpenMD::ConstraintStamp_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 0x100000000;
      pMVar11 = local_60;
    } while (uVar10 < (ulong)((long)(local_50->constraintStamps_).
                                    super__Vector_base<OpenMD::ConstraintStamp_*,_std::allocator<OpenMD::ConstraintStamp_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar6 >> 3)
            );
  }
  (*this->_vptr_MoleculeCreator[0xb])(this,pMVar11);
  if ((local_50->ConstrainTotalCharge).super_ParameterBase.empty_ == false) {
    pMVar11->constrainTotalCharge_ =
         (bool)(local_50->ConstrainTotalCharge).super_ParameterBase.field_0x2b;
  }
  Molecule::complete(pMVar11);
  if (local_48._M_current != (Atom **)0x0) {
    operator_delete(local_48._M_current,(long)local_38 - (long)local_48._M_current);
  }
  return pMVar11;
}

Assistant:

Molecule* MoleculeCreator::createMolecule(ForceField* ff,
                                            MoleculeStamp* molStamp,
                                            int globalIndex,
                                            LocalIndexManager* localIndexMan) {
    Molecule* mol = new Molecule(globalIndex, molStamp);

    // create atoms
    Atom* atom;
    AtomStamp* currentAtomStamp;
    size_t nAtom = molStamp->getNAtoms();
    for (size_t i = 0; i < nAtom; ++i) {
      currentAtomStamp = molStamp->getAtomStamp(i);
      atom             = createAtom(ff, currentAtomStamp, localIndexMan);
      mol->addAtom(atom);
    }

    // create rigidbodies
    RigidBody* rb;
    RigidBodyStamp* currentRigidBodyStamp;
    size_t nRigidbodies = molStamp->getNRigidBodies();

    for (size_t i = 0; i < nRigidbodies; ++i) {
      currentRigidBodyStamp = molStamp->getRigidBodyStamp(i);
      rb = createRigidBody(molStamp, mol, currentRigidBodyStamp, localIndexMan);
      mol->addRigidBody(rb);
    }

    // create bonds
    Bond* bond;
    BondStamp* currentBondStamp;
    size_t nBonds = molStamp->getNBonds();

    for (size_t i = 0; i < nBonds; ++i) {
      currentBondStamp = molStamp->getBondStamp(i);
      bond             = createBond(ff, mol, currentBondStamp, localIndexMan);
      mol->addBond(bond);
    }

    // create bends
    Bend* bend;
    BendStamp* currentBendStamp;
    size_t nBends = molStamp->getNBends();
    for (size_t i = 0; i < nBends; ++i) {
      currentBendStamp = molStamp->getBendStamp(i);
      bend             = createBend(ff, mol, currentBendStamp, localIndexMan);
      mol->addBend(bend);
    }

    // create torsions
    Torsion* torsion;
    TorsionStamp* currentTorsionStamp;
    size_t nTorsions = molStamp->getNTorsions();
    for (size_t i = 0; i < nTorsions; ++i) {
      currentTorsionStamp = molStamp->getTorsionStamp(i);
      torsion = createTorsion(ff, mol, currentTorsionStamp, localIndexMan);
      mol->addTorsion(torsion);
    }

    // create inversions
    Inversion* inversion;
    InversionStamp* currentInversionStamp;
    size_t nInversions = molStamp->getNInversions();
    for (size_t i = 0; i < nInversions; ++i) {
      currentInversionStamp = molStamp->getInversionStamp(i);
      inversion =
          createInversion(ff, mol, currentInversionStamp, localIndexMan);
      if (inversion != NULL) { mol->addInversion(inversion); }
    }

    // create cutoffGroups
    CutoffGroup* cutoffGroup;
    CutoffGroupStamp* currentCutoffGroupStamp;
    size_t nCutoffGroups = molStamp->getNCutoffGroups();
    for (size_t i = 0; i < nCutoffGroups; ++i) {
      currentCutoffGroupStamp = molStamp->getCutoffGroupStamp(i);
      cutoffGroup =
          createCutoffGroup(mol, currentCutoffGroupStamp, localIndexMan);
      mol->addCutoffGroup(cutoffGroup);
    }

    // every free atom is a cutoff group
    std::vector<Atom*> freeAtoms;
    std::vector<Atom*>::iterator ai;
    std::vector<Atom*>::iterator fai;

    // add all atoms into allAtoms set
    for (atom = mol->beginAtom(fai); atom != NULL; atom = mol->nextAtom(fai)) {
      freeAtoms.push_back(atom);
    }

    Molecule::CutoffGroupIterator ci;
    CutoffGroup* cg;

    for (cg = mol->beginCutoffGroup(ci); cg != NULL;
         cg = mol->nextCutoffGroup(ci)) {
      for (atom = cg->beginAtom(ai); atom != NULL; atom = cg->nextAtom(ai)) {
        // erase the atoms belong to cutoff groups from freeAtoms vector
        freeAtoms.erase(std::remove(freeAtoms.begin(), freeAtoms.end(), atom),
                        freeAtoms.end());
      }
    }

    // loop over the free atoms and then create one cutoff group for
    // every single free atom

    for (fai = freeAtoms.begin(); fai != freeAtoms.end(); ++fai) {
      cutoffGroup = createCutoffGroup(mol, *fai, localIndexMan);
      mol->addCutoffGroup(cutoffGroup);
    }

    // create bonded constraintPairs:
    createConstraintPair(mol);

    // create non-bonded constraintPairs
    for (std::size_t i = 0; i < molStamp->getNConstraints(); ++i) {
      ConstraintStamp* cStamp = molStamp->getConstraintStamp(i);
      Atom* atomA;
      Atom* atomB;

      atomA = mol->getAtomAt(cStamp->getA());
      atomB = mol->getAtomAt(cStamp->getB());
      assert(atomA && atomB);

      bool printConstraintForce = false;

      if (cStamp->havePrintConstraintForce()) {
        printConstraintForce = cStamp->getPrintConstraintForce();
      }

      if (!cStamp->haveConstrainedDistance()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Constraint Error: A non-bond constraint was specified\n"
                 "\twithout providing a value for the constrainedDistance.\n");
        painCave.isFatal = 1;
        simError();
      } else {
        RealType distance         = cStamp->getConstrainedDistance();
        ConstraintElem* consElemA = new ConstraintElem(atomA);
        ConstraintElem* consElemB = new ConstraintElem(atomB);
        ConstraintPair* cPair     = new ConstraintPair(
            consElemA, consElemB, distance, printConstraintForce);
        mol->addConstraintPair(cPair);
      }
    }

    // now create the constraint elements:

    createConstraintElem(mol);

    // Does this molecule stamp define a total constrained charge value?
    // If so, let the created molecule know about it.
    if (molStamp->haveConstrainTotalCharge()) {
      mol->setConstrainTotalCharge(molStamp->getConstrainTotalCharge());
    }

    // The construction of this molecule is finished:
    mol->complete();

    return mol;
  }